

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.h
# Opt level: O1

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_WriterBase)._vptr_WriterBase = (_func_int **)&PTR__FastWriter_002d7480;
  pcVar2 = (this->document_)._M_dataplus._M_p;
  paVar1 = &(this->document_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~FastWriter () {}